

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_misc.cpp
# Opt level: O2

spv_result_t spvtools::val::MiscPass(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  ushort uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint scope;
  spv_result_t sVar5;
  Function *pFVar6;
  char *pcVar7;
  string sStack_248;
  _Any_data local_228;
  code *local_218;
  code *local_210;
  undefined1 local_200 [464];
  spv_result_t local_30;
  
  uVar2 = (inst->inst_).opcode;
  if (uVar2 == 1) {
    bVar1 = ValidationState_t::IsVoidType(_,(inst->inst_).type_id);
    if (bVar1) {
      ValidationState_t::diag((DiagnosticStream *)local_200,_,SPV_ERROR_INVALID_ID,inst);
      pcVar7 = "Cannot create undefined values with void type";
LAB_0018076b:
      std::operator<<((ostream *)local_200,pcVar7);
      sVar5 = local_30;
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_200);
      if (sVar5 != SPV_SUCCESS) {
        return sVar5;
      }
    }
    else {
      bVar1 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
      if (((bVar1) &&
          (bVar1 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id),
          bVar1)) && (bVar1 = ValidationState_t::IsPointerType(_,(inst->inst_).type_id), !bVar1)) {
        ValidationState_t::diag((DiagnosticStream *)local_200,_,SPV_ERROR_INVALID_ID,inst);
        pcVar7 = "Cannot create undefined values with 8- or 16-bit types";
        goto LAB_0018076b;
      }
    }
    uVar2 = (inst->inst_).opcode;
  }
  if (uVar2 - 0x14f4 < 2) {
    pFVar6 = ValidationState_t::function(_,inst->function_->id_);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_200,
               "OpBeginInvocationInterlockEXT/OpEndInvocationInterlockEXT require Fragment execution model"
               ,(allocator<char> *)&sStack_248);
    Function::RegisterExecutionModelLimitation(pFVar6,ExecutionModelFragment,(string *)local_200);
    std::__cxx11::string::_M_dispose();
    pFVar6 = ValidationState_t::function(_,inst->function_->id_);
    local_228._M_unused._M_object = (void *)0x0;
    local_228._8_8_ = 0;
    local_210 = std::
                _Function_handler<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_misc.cpp:136:32)>
                ::_M_invoke;
    local_218 = std::
                _Function_handler<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/validate_misc.cpp:136:32)>
                ::_M_manager;
    std::__cxx11::
    list<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>,_std::allocator<std::function<bool_(const_spvtools::val::ValidationState_t_&,_const_spvtools::val::Function_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*)>_>_>
    ::push_back(&pFVar6->limitations_,(value_type *)&local_228);
    if (local_218 == (code *)0x0) {
      return SPV_SUCCESS;
    }
    (*local_218)(&local_228,&local_228,__destroy_functor);
    return SPV_SUCCESS;
  }
  if (uVar2 == 0x13c0) {
    scope = Instruction::GetOperandAs<unsigned_int>(inst,2);
    sVar5 = ValidateScope(_,inst,scope);
    if (sVar5 != SPV_SUCCESS) {
      return sVar5;
    }
    ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_200,_,scope);
    if (local_200[4] == true) {
      bVar1 = spvIsVulkanEnv(_->context_->target_env);
      if (bVar1) {
        if ((local_200._0_4_ & 0xfffffffd) != 1) {
          ValidationState_t::diag((DiagnosticStream *)local_200,_,SPV_ERROR_INVALID_DATA,inst);
          ValidationState_t::VkErrorID_abi_cxx11_(&sStack_248,_,0x122c,(char *)0x0);
          std::operator<<((ostream *)local_200,(string *)&sStack_248);
          std::operator<<((ostream *)local_200,"Scope must be Subgroup or Device");
          std::__cxx11::string::_M_dispose();
          goto LAB_00180bd8;
        }
      }
      else {
        bVar1 = spvIsOpenCLEnv(_->context_->target_env);
        if (local_200._0_4_ - 4 < 0xfffffffd && bVar1) {
          ValidationState_t::diag((DiagnosticStream *)local_200,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar7 = "Scope must be Subgroup, Workgroup, or Device";
          goto LAB_00180bc9;
        }
      }
    }
    bVar1 = ValidationState_t::IsUnsigned64BitHandle(_,(inst->inst_).type_id);
    if (bVar1) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag((DiagnosticStream *)local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar7 = 
    "Expected Value to be a vector of two components of unsigned integer or 64bit unsigned integer";
  }
  else {
    if (uVar2 == 0x1504) {
      pFVar6 = ValidationState_t::function(_,inst->function_->id_);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_200,
                 "OpDemoteToHelperInvocationEXT requires Fragment execution model",
                 (allocator<char> *)&sStack_248);
      Function::RegisterExecutionModelLimitation(pFVar6,ExecutionModelFragment,(string *)local_200);
      std::__cxx11::string::_M_dispose();
      return SPV_SUCCESS;
    }
    if (uVar2 == 0x1505) {
      uVar4 = (inst->inst_).type_id;
      pFVar6 = ValidationState_t::function(_,inst->function_->id_);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_200,"OpIsHelperInvocationEXT requires Fragment execution model",
                 (allocator<char> *)&sStack_248);
      Function::RegisterExecutionModelLimitation(pFVar6,ExecutionModelFragment,(string *)local_200);
      std::__cxx11::string::_M_dispose();
      bVar1 = ValidationState_t::IsBoolScalarType(_,uVar4);
      if (bVar1) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_200,_,SPV_ERROR_INVALID_DATA,inst);
      std::operator<<((ostream *)local_200,"Expected bool scalar type as Result Type: ");
      pcVar7 = spvOpcodeString((uint)(inst->inst_).opcode);
      std::operator<<((ostream *)local_200,pcVar7);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_200);
      return local_30;
    }
    if (uVar2 == 0x15fe) {
      uVar4 = ValidationState_t::GetOperandTypeId(_,inst,0);
      if ((uVar4 != 0) && (bVar1 = ValidationState_t::IsBoolScalarType(_,uVar4), bVar1)) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_200,_,SPV_ERROR_INVALID_ID,inst);
      pcVar7 = "Value operand of OpAssumeTrueKHR must be a boolean scalar";
    }
    else {
      if (uVar2 != 0x15ff) {
        return SPV_SUCCESS;
      }
      uVar4 = (inst->inst_).type_id;
      bVar1 = ValidationState_t::IsBoolScalarOrVectorType(_,uVar4);
      if ((bVar1) || (bVar1 = ValidationState_t::IsIntScalarOrVectorType(_,uVar4), bVar1)) {
        uVar3 = ValidationState_t::GetOperandTypeId(_,inst,2);
        if (uVar3 == uVar4) {
          uVar3 = ValidationState_t::GetOperandTypeId(_,inst,3);
          if (uVar3 == uVar4) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag((DiagnosticStream *)local_200,_,SPV_ERROR_INVALID_ID,inst);
          pcVar7 = "Type of ExpectedValue operand of OpExpectKHR does not match the result type ";
        }
        else {
          ValidationState_t::diag((DiagnosticStream *)local_200,_,SPV_ERROR_INVALID_ID,inst);
          pcVar7 = "Type of Value operand of OpExpectKHR does not match the result type ";
        }
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_200,_,SPV_ERROR_INVALID_ID,inst);
        pcVar7 = "Result of OpExpectKHR must be a scalar or vector of integer type or boolean type";
      }
    }
  }
LAB_00180bc9:
  std::operator<<((ostream *)local_200,pcVar7);
LAB_00180bd8:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_200);
  if (local_30 == SPV_SUCCESS) {
    return SPV_SUCCESS;
  }
  return local_30;
}

Assistant:

spv_result_t MiscPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpUndef:
      if (auto error = ValidateUndef(_, inst)) return error;
      break;
    default:
      break;
  }
  switch (inst->opcode()) {
    case spv::Op::OpBeginInvocationInterlockEXT:
    case spv::Op::OpEndInvocationInterlockEXT:
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              spv::ExecutionModel::Fragment,
              "OpBeginInvocationInterlockEXT/OpEndInvocationInterlockEXT "
              "require Fragment execution model");

      _.function(inst->function()->id())
          ->RegisterLimitation([](const ValidationState_t& state,
                                  const Function* entry_point,
                                  std::string* message) {
            const auto* execution_modes =
                state.GetExecutionModes(entry_point->id());

            auto find_interlock = [](const spv::ExecutionMode& mode) {
              switch (mode) {
                case spv::ExecutionMode::PixelInterlockOrderedEXT:
                case spv::ExecutionMode::PixelInterlockUnorderedEXT:
                case spv::ExecutionMode::SampleInterlockOrderedEXT:
                case spv::ExecutionMode::SampleInterlockUnorderedEXT:
                case spv::ExecutionMode::ShadingRateInterlockOrderedEXT:
                case spv::ExecutionMode::ShadingRateInterlockUnorderedEXT:
                  return true;
                default:
                  return false;
              }
            };

            bool found = false;
            if (execution_modes) {
              auto i = std::find_if(execution_modes->begin(),
                                    execution_modes->end(), find_interlock);
              found = (i != execution_modes->end());
            }

            if (!found) {
              *message =
                  "OpBeginInvocationInterlockEXT/OpEndInvocationInterlockEXT "
                  "require a fragment shader interlock execution mode.";
              return false;
            }
            return true;
          });
      break;
    case spv::Op::OpDemoteToHelperInvocationEXT:
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              spv::ExecutionModel::Fragment,
              "OpDemoteToHelperInvocationEXT requires Fragment execution "
              "model");
      break;
    case spv::Op::OpIsHelperInvocationEXT: {
      const uint32_t result_type = inst->type_id();
      _.function(inst->function()->id())
          ->RegisterExecutionModelLimitation(
              spv::ExecutionModel::Fragment,
              "OpIsHelperInvocationEXT requires Fragment execution model");
      if (!_.IsBoolScalarType(result_type))
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected bool scalar type as Result Type: "
               << spvOpcodeString(inst->opcode());
      break;
    }
    case spv::Op::OpReadClockKHR:
      if (auto error = ValidateShaderClock(_, inst)) {
        return error;
      }
      break;
    case spv::Op::OpAssumeTrueKHR:
      if (auto error = ValidateAssumeTrue(_, inst)) {
        return error;
      }
      break;
    case spv::Op::OpExpectKHR:
      if (auto error = ValidateExpect(_, inst)) {
        return error;
      }
      break;
    default:
      break;
  }

  return SPV_SUCCESS;
}